

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

_Bool cf_ssl_is_alive(Curl_cfilter *cf,Curl_easy *data,_Bool *input_pending)

{
  undefined8 uVar1;
  Curl_cfilter *pCVar2;
  _Bool _Var3;
  int iVar4;
  
  uVar1 = *(undefined8 *)((long)cf->ctx + 0x38);
  *(Curl_easy **)((long)cf->ctx + 0x38) = data;
  iVar4 = (*Curl_ssl->check_cxn)(cf,data);
  *(undefined8 *)((long)cf->ctx + 0x38) = uVar1;
  if (iVar4 < 1) {
    if (iVar4 == 0) {
      *input_pending = false;
    }
    else {
      pCVar2 = cf->next;
      if (pCVar2 != (Curl_cfilter *)0x0) {
        _Var3 = (*pCVar2->cft->is_alive)(pCVar2,data,input_pending);
        return _Var3;
      }
    }
    _Var3 = false;
  }
  else {
    *input_pending = true;
    _Var3 = true;
  }
  return _Var3;
}

Assistant:

static bool cf_ssl_is_alive(struct Curl_cfilter *cf, struct Curl_easy *data,
                            bool *input_pending)
{
  struct cf_call_data save;
  int result;
  /*
   * This function tries to determine connection status.
   *
   * Return codes:
   *     1 means the connection is still in place
   *     0 means the connection has been closed
   *    -1 means the connection status is unknown
   */
  CF_DATA_SAVE(save, cf, data);
  result = Curl_ssl->check_cxn(cf, data);
  CF_DATA_RESTORE(cf, save);
  if(result > 0) {
    *input_pending = TRUE;
    return TRUE;
  }
  if(result == 0) {
    *input_pending = FALSE;
    return FALSE;
  }
  /* ssl backend does not know */
  return cf->next ?
    cf->next->cft->is_alive(cf->next, data, input_pending) :
    FALSE; /* pessimistic in absence of data */
}